

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource_iterator.cpp
# Opt level: O0

QFileInfo __thiscall QResourceFileEngineIterator::currentFileInfo(QResourceFileEngineIterator *this)

{
  long lVar1;
  long *in_RSI;
  QFileInfoPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileInfo *in_stack_ffffffffffffff78;
  QFileInfo *in_stack_ffffffffffffff80;
  QSharedDataPointer<QFileInfoPrivate> this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QFileInfoPrivate_*>)
       (totally_ordered_wrapper<QFileInfoPrivate_*>)in_RDI;
  (**(code **)(*in_RSI + 0x28))();
  QFileInfo::QFileInfo((QFileInfo *)this_00.d.ptr,(QString *)in_RDI);
  QFileInfo::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QFileInfo::~QFileInfo((QFileInfo *)0x2ef698);
  QString::~QString((QString *)0x2ef6a2);
  QFileInfo::QFileInfo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QFileInfoPrivate>)(QSharedDataPointer<QFileInfoPrivate>)this_00.d.ptr
    ;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo QResourceFileEngineIterator::currentFileInfo() const
{
    m_fileInfo = QFileInfo(currentFilePath());
    return m_fileInfo;
}